

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

Vec_Ptr_t * Abc_AigDfsMap(Abc_Ntk_t *pNtk)

{
  void *Entry;
  int iVar1;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pAVar2;
  int iVar3;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                  ,0x4db,"Vec_Ptr_t *Abc_AigDfsMap(Abc_Ntk_t *)");
  }
  Abc_NtkIncrementTravId(pNtk);
  vNodes = Vec_PtrAlloc(100);
  for (iVar3 = 0; iVar1 = pNtk->vCos->nSize, iVar3 < iVar1; iVar3 = iVar3 + 1) {
    pAVar2 = Abc_NtkCo(pNtk,iVar3);
    if (pNtk->vCos->nSize - pNtk->nBarBufs <= iVar3) {
      Abc_AigDfs_rec((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray],vNodes);
      Abc_NodeSetTravIdCurrent(pAVar2);
      Entry = pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray];
      if ((*(uint *)((long)Entry + 0x14) & 0xf) != 8) {
        __assert_fail("Abc_ObjIsLatch(Abc_ObjFanout0(pNode))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                      ,0x4e8,"Vec_Ptr_t *Abc_AigDfsMap(Abc_Ntk_t *)");
      }
      Vec_PtrPush(vNodes,Entry);
    }
  }
  iVar3 = 0;
  while( true ) {
    if (iVar1 <= iVar3) {
      return vNodes;
    }
    pAVar2 = Abc_NtkCo(pNtk,iVar3);
    if (pNtk->vCos->nSize - pNtk->nBarBufs <= iVar3) break;
    Abc_AigDfs_rec((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray],vNodes);
    if ((*(uint *)&pAVar2->field_0x14 & 0xf) - 5 < 0xfffffffe) {
      __assert_fail("Abc_ObjIsCo(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                    ,0x4f1,"Vec_Ptr_t *Abc_AigDfsMap(Abc_Ntk_t *)");
    }
    Abc_NodeSetTravIdCurrent(pAVar2);
    iVar3 = iVar3 + 1;
    iVar1 = pNtk->vCos->nSize;
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Abc_AigDfsMap( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    // collect cones of barbufs
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        if ( i < Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            continue;
        Abc_AigDfs_rec( Abc_ObjFanin0(pNode), vNodes );
        Abc_NodeSetTravIdCurrent( pNode );
        // collect latch as a placeholder
        assert( Abc_ObjIsLatch(Abc_ObjFanout0(pNode)) );
        Vec_PtrPush( vNodes, Abc_ObjFanout0(pNode) );
    }
    // collect nodes of real POs
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        if ( i >= Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            break;
        Abc_AigDfs_rec( Abc_ObjFanin0(pNode), vNodes );
        assert( Abc_ObjIsCo(pNode) );
        Abc_NodeSetTravIdCurrent( pNode );
    }
    return vNodes;
}